

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

int hydro_hash_update(hydro_hash_state *state,void *in_,size_t in_len)

{
  byte *pbVar1;
  uint8_t uVar2;
  long lVar3;
  uint8_t *in;
  uint8_t *buf;
  ulong uVar4;
  
  if (in_len != 0) {
    do {
      uVar4 = -((ulong)state->buf_off - 0x10);
      if (in_len < uVar4) {
        uVar4 = in_len;
      }
      if ((ulong)state->buf_off != 0x10) {
        lVar3 = 0;
        do {
          pbVar1 = (byte *)((long)state->state + lVar3 + (ulong)state->buf_off);
          *pbVar1 = *pbVar1 ^ *(byte *)((long)in_ + lVar3);
          lVar3 = lVar3 + 1;
        } while (uVar4 + (uVar4 == 0) != lVar3);
      }
      uVar2 = state->buf_off + (char)uVar4;
      state->buf_off = uVar2;
      if (uVar2 == '\x10') {
        gimli_core_u8((uint8_t *)state,'\0');
        state->buf_off = '\0';
      }
      in_ = (void *)((long)in_ + uVar4);
      in_len = in_len - uVar4;
    } while (in_len != 0);
  }
  return 0;
}

Assistant:

int
hydro_hash_update(hydro_hash_state *state, const void *in_, size_t in_len)
{
    const uint8_t *in  = (const uint8_t *) in_;
    uint8_t       *buf = (uint8_t *) (void *) state->state;
    size_t         left;
    size_t         ps;
    size_t         i;

    while (in_len > 0) {
        left = gimli_RATE - state->buf_off;
        if ((ps = in_len) > left) {
            ps = left;
        }
        for (i = 0; i < ps; i++) {
            buf[state->buf_off + i] ^= in[i];
        }
        in += ps;
        in_len -= ps;
        state->buf_off += (uint8_t) ps;
        if (state->buf_off == gimli_RATE) {
            gimli_core_u8(buf, 0);
            state->buf_off = 0;
        }
    }
    return 0;
}